

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::init_ssl(torrent *this,string_view cert)

{
  unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_> __p;
  int iVar1;
  undefined4 extraout_var;
  error_code *in_R8;
  string_view pem;
  unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_> ctx;
  error_code ec;
  undefined1 local_48 [24];
  element_type *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  pem._M_len = cert._M_str;
  ec.val_ = 0x15;
  ::std::make_unique<boost::asio::ssl::context,boost::asio::ssl::context_base::method>
            ((method *)&ctx);
  boost::asio::ssl::context::set_options
            ((context *)
             ctx._M_t.
             super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
             ._M_t.
             super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
             .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl,0x82000850);
  ec.val_ = 0;
  ec.failed_ = false;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  boost::asio::ssl::context::set_verify_mode
            ((context *)
             ctx._M_t.
             super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
             ._M_t.
             super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
             .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl,7,&ec);
  if (ec.failed_ == false) {
    local_48._16_8_ = verify_peer_cert;
    local_30 = (element_type *)0x0;
    local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
    boost::asio::ssl::context::
    set_verify_callback<std::_Bind<bool(libtorrent::aux::torrent::*(libtorrent::aux::torrent*,std::_Placeholder<1>,std::_Placeholder<2>))(bool,boost::asio::ssl::verify_context&)>>
              ((context *)
               ctx._M_t.
               super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
               ._M_t.
               super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
               .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl,
               (_Bind<bool_(libtorrent::aux::torrent::*(libtorrent::aux::torrent_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(bool,_boost::asio::ssl::verify_context_&)>
                *)(local_48 + 0x10),&ec);
    if (ec.failed_ == false) {
      pem._M_str = (char *)&ec;
      aux::ssl::set_trust_certificate
                (*(ssl **)ctx._M_t.
                          super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
                          .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl,
                 (native_context_type)cert._M_len,pem,in_R8);
      __p = ctx;
      if (ec.failed_ != true) {
        ctx._M_t.
        super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
        ._M_t.
        super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
        .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl =
             (__uniq_ptr_data<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>,_true,_true>
              )(__uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
                )0x0;
        ::std::
        __uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
        ::reset((__uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
                 *)&this->m_ssl_ctx,
                (pointer)__p._M_t.
                         super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
                         .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl);
        iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)local_48);
        alert_manager::emplace_alert<libtorrent::torrent_need_cert_alert,libtorrent::torrent_handle>
                  ((alert_manager *)CONCAT44(extraout_var,iVar1),(torrent_handle *)local_48);
        ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
        goto LAB_002d3abe;
      }
    }
  }
  set_error(this,&ec,(file_index_t)0xfffffffd);
  pause(this);
LAB_002d3abe:
  ::std::unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>::
  ~unique_ptr(&ctx);
  return;
}

Assistant:

void torrent::init_ssl(string_view cert)
	{
		// create the SSL context for this torrent. We need to
		// inject the root certificate, and no other, to
		// verify other peers against
		std::unique_ptr<ssl::context> ctx(std::make_unique<ssl::context>(ssl::context::tls));

		ctx->set_options(ssl::context::default_workarounds
			| ssl::context::no_sslv2
			| ssl::context::no_sslv3
			| ssl::context::single_dh_use);

		error_code ec;
		ctx->set_verify_mode(ssl::context::verify_peer
			| ssl::context::verify_fail_if_no_peer_cert
			| ssl::context::verify_client_once, ec);
		if (ec)
		{
			set_error(ec, torrent_status::error_file_ssl_ctx);
			pause();
			return;
		}

		// the verification function verifies the distinguished name
		// of a peer certificate to make sure it matches the info-hash
		// of the torrent, or that it's a "star-cert"
		ctx->set_verify_callback(
				std::bind(&torrent::verify_peer_cert, this, _1, _2)
				, ec);
		if (ec)
		{
			set_error(ec, torrent_status::error_file_ssl_ctx);
			pause();
			return;
		}

		// set the root certificate as trust
		ssl::set_trust_certificate(ctx->native_handle(), cert, ec);
		if (ec)
		{
			set_error(ec, torrent_status::error_file_ssl_ctx);
			pause();
			return;
		}

#if 0
		char filename[100];
		std::snprintf(filename, sizeof(filename), "/tmp/%u.pem", random());
		FILE* f = fopen(filename, "w+");
		fwrite(cert.c_str(), cert.size(), 1, f);
		fclose(f);
		ctx->load_verify_file(filename);
#endif

		// if all went well, set the torrent ssl context to this one
		m_ssl_ctx = std::move(ctx);
		// tell the client we need a cert for this torrent
		alerts().emplace_alert<torrent_need_cert_alert>(get_handle());
	}